

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint flag)

{
  bool bVar1;
  reference ppSVar2;
  ulong uVar3;
  int local_74;
  DFA *pDStack_70;
  int i;
  State *s;
  char *space;
  int local_58;
  int mem;
  int nnext;
  int kStateCacheOverhead;
  key_type local_48;
  _Node_iterator_base<re2::DFA::State_*,_true> local_40;
  iterator it;
  State state;
  uint flag_local;
  int ninst_local;
  int *inst_local;
  DFA *this_local;
  
  Mutex::AssertHeld(&this->mutex_);
  local_48 = (key_type)&it;
  it.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur =
       (_Node_iterator_base<re2::DFA::State_*,_true>)
       (_Node_iterator_base<re2::DFA::State_*,_true>)inst;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
       ::find(&this->state_cache_,&local_48);
  _nnext = (__node_type *)
           std::
           unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
           ::end(&this->state_cache_);
  bVar1 = std::__detail::operator!=
                    (&local_40,(_Node_iterator_base<re2::DFA::State_*,_true> *)&nnext);
  if (bVar1) {
    ppSVar2 = std::__detail::_Node_iterator<re2::DFA::State_*,_true,_true>::operator*
                        ((_Node_iterator<re2::DFA::State_*,_true,_true> *)&local_40);
    this_local = (DFA *)*ppSVar2;
  }
  else {
    mem = 0x20;
    local_58 = Prog::bytemap_range(this->prog_);
    local_58 = local_58 + 1;
    space._4_4_ = local_58 * 8 + 0x10 + ninst * 4;
    if (this->mem_budget_ < (long)(space._4_4_ + 0x20)) {
      this->mem_budget_ = -1;
      this_local = (DFA *)0x0;
    }
    else {
      this->mem_budget_ = this->mem_budget_ - (long)(space._4_4_ + 0x20);
      uVar3 = (ulong)space._4_4_;
      if ((long)uVar3 < 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pDStack_70 = (DFA *)operator_new__(uVar3);
      s = (State *)pDStack_70;
      for (local_74 = 0; local_74 < local_58; local_74 = local_74 + 1) {
        std::atomic<re2::DFA::State_*>::atomic
                  ((atomic<re2::DFA::State_*> *)
                   ((long)&(pDStack_70->mutex_).mutex_ + (long)local_74 * 8),(__pointer_type)0x0);
      }
      pDStack_70->prog_ = (Prog *)((long)&(pDStack_70->mutex_).mutex_ + (long)local_58 * 8);
      memmove(pDStack_70->prog_,inst,(long)ninst << 2);
      pDStack_70->kind_ = ninst;
      *(uint *)&pDStack_70->init_failed_ = flag;
      std::
      unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
      ::insert(&this->state_cache_,(value_type *)&stack0xffffffffffffff90);
      this_local = pDStack_70;
    }
  }
  return (State *)this_local;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  State state = {inst, ninst, flag};
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (DebugDFA)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 32 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 32;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = new char[mem];
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (DebugDFA)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}